

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O3

char * __thiscall IrSim::print3(IrSim *this,C_IC *i)

{
  size_t __maxlen;
  char *pcVar1;
  _Alloc_hider _Var2;
  _Alloc_hider _Var3;
  long lVar4;
  char *pcVar5;
  string local_90;
  string local_70;
  string local_50;
  
  if ((i->arg2).kind == 0) {
    pcVar5 = print2(this,i);
    return pcVar5;
  }
  lVar4 = (long)i->kind;
  __maxlen = this->PBSIZE;
  pcVar5 = this->pb;
  if (lVar4 < 0x14) {
    pcVar1 = icFmt[lVar4];
    Operand::str_abi_cxx11_(&local_70,&i->target);
    _Var3._M_p = local_70._M_dataplus._M_p;
    Operand::str_abi_cxx11_(&local_90,&i->arg1);
    _Var2._M_p = local_90._M_dataplus._M_p;
    Operand::str_abi_cxx11_(&local_50,&i->arg2);
    snprintf(pcVar5,__maxlen,pcVar1,_Var3._M_p,_Var2._M_p,local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0010ad63;
  }
  else {
    pcVar1 = icFmt[lVar4];
    Operand::str_abi_cxx11_(&local_70,&i->arg1);
    _Var3._M_p = local_70._M_dataplus._M_p;
    Operand::str_abi_cxx11_(&local_90,&i->arg2);
    _Var2._M_p = local_90._M_dataplus._M_p;
    Operand::str_abi_cxx11_(&local_50,&i->target);
    snprintf(pcVar5,__maxlen,pcVar1,_Var3._M_p,_Var2._M_p,local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0010ad63;
  }
  operator_delete(local_50._M_dataplus._M_p);
LAB_0010ad63:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return this->pb;
}

Assistant:

const char *IrSim::print3(C_IC &i) const {
    if (i.arg2.kind == IR_NONE) return print2(i);
    if (i.kind < IC_RELOP)
        snprintf(pb, PBSIZE, icFmt[i.kind], i[0].str().c_str(), i[1].str().c_str(), i[2].str().c_str());
    else
        snprintf(pb, PBSIZE, icFmt[i.kind], i[1].str().c_str(), i[2].str().c_str(), i[0].str().c_str());
    return pb;
}